

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O3

void __thiscall chrono::ChSystem::Add(ChSystem *this,shared_ptr<chrono::ChPhysicsItem> *item)

{
  element_type *peVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  long local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  long local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  long local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  peVar1 = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
LAB_0051c1b2:
    local_20 = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_20->_M_use_count = local_20->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_20->_M_use_count = local_20->_M_use_count + 1;
      }
    }
    local_28 = peVar1;
    (*(this->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x29])(this,&local_28)
    ;
    this_00 = local_20;
    goto LAB_0051c27e;
  }
  lVar2 = __dynamic_cast(peVar1,&ChPhysicsItem::typeinfo,&ChBody::typeinfo,0);
  if (lVar2 == 0) {
    lVar2 = __dynamic_cast(peVar1,&ChPhysicsItem::typeinfo,&ChShaft::typeinfo,0);
    if (lVar2 == 0) {
      lVar2 = __dynamic_cast(peVar1,&ChPhysicsItem::typeinfo,&ChLinkBase::typeinfo,0);
      if (lVar2 == 0) {
        lVar2 = __dynamic_cast(peVar1,&ChPhysicsItem::typeinfo,&fea::ChMesh::typeinfo,0);
        if (lVar2 == 0) goto LAB_0051c1b2;
        this_00 = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          local_60 = this_00;
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
              goto LAB_0051c260;
            }
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
LAB_0051c260:
        local_68 = lVar2;
        (*(this->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x28])
                  (this,&local_68);
        this_01 = local_60;
      }
      else {
        this_00 = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          local_50 = this_00;
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
              goto LAB_0051c21b;
            }
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
LAB_0051c21b:
        local_58 = lVar2;
        (*(this->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x27])
                  (this,&local_58);
        this_01 = local_50;
      }
    }
    else {
      this_00 = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        local_40 = this_00;
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
            goto LAB_0051c143;
          }
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
LAB_0051c143:
      local_48 = lVar2;
      (*(this->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x26])
                (this,&local_48);
      this_01 = local_40;
    }
  }
  else {
    this_00 = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      local_30 = this_00;
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
          goto LAB_0051c0b2;
        }
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
LAB_0051c0b2:
    local_38 = lVar2;
    (*(this->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x25])(this,&local_38)
    ;
    this_01 = local_30;
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
LAB_0051c27e:
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void ChSystem::Add(std::shared_ptr<ChPhysicsItem> item) {
    if (auto body = std::dynamic_pointer_cast<ChBody>(item)) {
        AddBody(body);
        return;
    }

    if (auto shaft = std::dynamic_pointer_cast<ChShaft>(item)) {
        AddShaft(shaft);
        return;
    }

    if (auto link = std::dynamic_pointer_cast<ChLinkBase>(item)) {
        AddLink(link);
        return;
    }

    if (auto mesh = std::dynamic_pointer_cast<fea::ChMesh>(item)) {
        AddMesh(mesh);
        return;
    }

    AddOtherPhysicsItem(item);
}